

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O2

Reals __thiscall Omega_h::symms_osh2inria_dim<1>(Omega_h *this,Reals *symms)

{
  Alloc *pAVar1;
  void *extraout_RDX;
  ulong uVar2;
  LO n;
  Reals RVar3;
  type f;
  Write<double> out;
  allocator local_61;
  string local_60;
  Write<double> local_40;
  Write<signed_char> local_30;
  
  pAVar1 = (symms->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar2 = pAVar1->size;
    n = (LO)(uVar2 >> 3);
  }
  else {
    n = (LO)((ulong)pAVar1 >> 6);
    uVar2 = (ulong)pAVar1 >> 3;
  }
  std::__cxx11::string::string((string *)&local_60,"",&local_61);
  Write<double>::Write(&local_40,(LO)(uVar2 >> 3),&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  Write<double>::Write((Write<double> *)&local_60,&symms->write_);
  Write<double>::Write((Write<double> *)&local_60.field_2,&local_40);
  parallel_for<Omega_h::symms_osh2inria_dim<1>(Omega_h::Read<double>)::_lambda(int)_1_&>
            (n,(type *)&local_60);
  Write<double>::Write(&local_30,(Write<signed_char> *)&local_40);
  Read<double>::Read((Read<signed_char> *)this,(Write<double> *)&local_30);
  Write<double>::~Write((Write<double> *)&local_30);
  symms_osh2inria_dim<1>(Omega_h::Read<double>)::{lambda(int)#1}::~Read
            ((_lambda_int__1_ *)&local_60);
  Write<double>::~Write(&local_40);
  RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar3.write_.shared_alloc_;
}

Assistant:

Reals symms_osh2inria_dim(Reals symms) {
  auto n = divide_no_remainder(symms.size(), symm_ncomps(dim));
  Write<Real> out(symms.size());
  auto f = OMEGA_H_LAMBDA(LO i) {
    auto iv = get_vector<symm_ncomps(dim)>(symms, i);
    auto is = vector2symm(iv);
    auto ov = symm2vector_inria(is);
    set_vector(out, i, ov);
  };
  parallel_for(n, f);
  return out;
}